

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O2

void des3_sdctr_encrypt_decrypt(ssh_cipher *ciph,void *vdata,int len)

{
  ssh_cipheralg *psVar1;
  LR LVar2;
  LR LVar3;
  uint8_t *p;
  uint8_t iv_buf [8];
  
  for (; 0 < len; len = len + -8) {
    psVar1 = ciph[-1].vt;
    iv_buf = (uint8_t  [8])
             ((ulong)psVar1 >> 0x38 | ((ulong)psVar1 & 0xff000000000000) >> 0x28 |
              ((ulong)psVar1 & 0xff0000000000) >> 0x18 | ((ulong)psVar1 & 0xff00000000) >> 8 |
              ((ulong)psVar1 & 0xff000000) << 8 | ((ulong)psVar1 & 0xff0000) << 0x18 |
              ((ulong)psVar1 & 0xff00) << 0x28 | (long)psVar1 << 0x38);
    ciph[-1].vt = (ssh_cipheralg *)((long)&psVar1->new + 1);
    LVar2 = des_load_lr(iv_buf);
    LVar2 = des_IP(LVar2);
    LVar2 = des_inner_cipher(LVar2,(des_keysched *)(ciph + -0x31),0,1);
    LVar2 = des_inner_cipher(LVar2,(des_keysched *)(ciph + -0x21),0xf,0xffffffffffffffff);
    LVar2 = des_inner_cipher(LVar2,(des_keysched *)(ciph + -0x11),0,1);
    LVar2 = des_FP(LVar2);
    LVar3 = des_load_lr(vdata);
    des_store_lr(vdata,(LR)((ulong)LVar2 ^ (ulong)LVar3));
    vdata = (void *)((long)vdata + 8);
  }
  smemclr(iv_buf,8);
  return;
}

Assistant:

static void des3_sdctr_encrypt_decrypt(ssh_cipher *ciph, void *vdata, int len)
{
    struct des3_sdctr_ctx *ctx = container_of(
        ciph, struct des3_sdctr_ctx, ciph);
    uint8_t *data = (uint8_t *)vdata;
    uint8_t iv_buf[8];
    for (; len > 0; len -= 8, data += 8) {
        /* Format the counter value into the buffer. */
        for (unsigned i = 0; i < SDCTR_WORDS; i++)
            PUT_BIGNUMINT_MSB_FIRST(
                iv_buf + 8 - BIGNUM_INT_BYTES - i*BIGNUM_INT_BYTES,
                ctx->counter[i]);

        /* Increment the counter. */
        BignumCarry carry = 1;
        for (unsigned i = 0; i < SDCTR_WORDS; i++)
            BignumADC(ctx->counter[i], carry, ctx->counter[i], 0, carry);

        /* Triple-encrypt the counter value from the IV. */
        LR lr = des_IP(des_load_lr(iv_buf));
        lr = des_inner_cipher(lr, &ctx->sched[0], ENCIPHER);
        lr = des_inner_cipher(lr, &ctx->sched[1], DECIPHER);
        lr = des_inner_cipher(lr, &ctx->sched[2], ENCIPHER);
        LR keystream = des_FP(lr);

        LR input = des_load_lr(data);
        LR output = des_xor_lr(input, keystream);
        des_store_lr(data, output);
    }
    smemclr(iv_buf, sizeof(iv_buf));
}